

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_MacProjector.cpp
# Opt level: O3

void __thiscall
Hydro::MacProjector::getFluxes
          (MacProjector *this,
          Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
          *a_flux,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_sol,
          Location a_loc)

{
  pointer paVar1;
  long lVar2;
  array<amrex::MultiFab_*,_3UL> *mfarr;
  pointer paVar3;
  
  if (*(this->m_needs_level_bcs).super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start != 0)
  {
    (*this->m_linop->_vptr_MLLinOp[3])(this->m_linop,0,0,0,0,0);
  }
  (*this->m_linop->_vptr_MLLinOp[0x22])(this->m_linop,a_flux,a_sol,(ulong)a_loc);
  if ((this->m_poisson)._M_t.
      super___uniq_ptr_impl<amrex::MLPoisson,_std::default_delete<amrex::MLPoisson>_>._M_t.
      super__Tuple_impl<0UL,_amrex::MLPoisson_*,_std::default_delete<amrex::MLPoisson>_>.
      super__Head_base<0UL,_amrex::MLPoisson_*,_false>._M_head_impl != (MLPoisson *)0x0) {
    paVar1 = (a_flux->
             super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
             ).
             super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (paVar3 = (a_flux->
                  super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                  ).
                  super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; paVar3 != paVar1; paVar3 = paVar3 + 1)
    {
      lVar2 = 0;
      do {
        amrex::MultiFab::mult(*(MultiFab **)((long)paVar3->_M_elems + lVar2),this->m_const_beta,0);
        lVar2 = lVar2 + 8;
      } while (lVar2 != 0x18);
    }
  }
  return;
}

Assistant:

void
MacProjector::getFluxes (const Vector<Array<MultiFab*,AMREX_SPACEDIM> >& a_flux,
                         const Vector<MultiFab*>& a_sol, MLMG::Location a_loc) const
{
    int ilev = 0;
    if (m_needs_level_bcs[ilev])
        m_linop->setLevelBC(ilev, nullptr);

    m_linop->getFluxes(a_flux, a_sol, a_loc);
    if (m_poisson) {
        for (auto const& mfarr : a_flux) {
            for (auto const& mfp : mfarr) {
                mfp->mult(m_const_beta);
            }
        }
    }
}